

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

ConstantValue * __thiscall
anon_unknown.dwarf_a31374::EvalVisitor::visit<slang::ast::ReplicationExpression>
          (EvalVisitor *this,ReplicationExpression *expr,EvalContext *context)

{
  bool bVar1;
  ConstantValue *this_00;
  long in_RDX;
  ConstantValue *in_RDI;
  ConstantValue cv;
  EvalContext *in_stack_000000b0;
  ReplicationExpression *in_stack_000000b8;
  ConstantValue *in_stack_ffffffffffffff68;
  Compilation *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  
  if (*(long *)(in_RDX + 0x10) == 0) {
    bVar1 = slang::ast::Expression::bad((Expression *)in_stack_ffffffffffffff70);
    if (bVar1) {
      bVar1 = slang::ast::EvalContext::cacheResults
                        ((EvalContext *)
                         CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      if (bVar1) {
        *(undefined1 **)(in_RDX + 0x10) = slang::ConstantValue::Invalid;
      }
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    else {
      slang::ast::ReplicationExpression::evalImpl(in_stack_000000b8,in_stack_000000b0);
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x614d0a);
      if ((bVar1) &&
         (bVar1 = slang::ast::EvalContext::cacheResults
                            ((EvalContext *)
                             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)), bVar1))
      {
        slang::ast::EvalContext::reportWarnings((EvalContext *)0x614d44);
        slang::ast::EvalContext::getCompilation((EvalContext *)0x614d50);
        this_00 = slang::ast::Compilation::allocConstant
                            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        *(ConstantValue **)(in_RDX + 0x10) = this_00;
        slang::ConstantValue::ConstantValue(this_00,in_stack_ffffffffffffff68);
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x614ddb);
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

ConstantValue visit(const T& expr, EvalContext& context) {
        if (expr.constant)
            return *expr.constant;

        if (expr.bad()) {
            if (context.cacheResults())
                expr.constant = &ConstantValue::Invalid;
            return nullptr;
        }

        ConstantValue cv = expr.evalImpl(context);
        if (cv && context.cacheResults()) {
            // If we're caching results we can't let any reported
            // diagnostics get lost because there won't be another
            // opportunity to see them, so make sure they get logged
            // to the compilation now.
            context.reportWarnings();
            expr.constant = context.getCompilation().allocConstant(std::move(cv));
            return *expr.constant;
        }

        return cv;
    }